

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LabelCase::iterate(LabelCase *this)

{
  GLenum GVar1;
  code *pcVar2;
  bool bVar3;
  deBool dVar4;
  int iVar5;
  NotSupportedError *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  MessageBuilder local_378;
  MessageBuilder local_1f8;
  char local_78 [8];
  char buffer [64];
  int outlen;
  GLuint object;
  char *msg;
  Functions *gl;
  LabelCase *local_10;
  LabelCase *this_local;
  
  local_10 = this;
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
         (bVar3 = isKHRDebugSupported((this->super_TestCase).m_context), bVar3))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar5 = (*pRVar6->_vptr_RenderContext[3])();
      msg = (char *)CONCAT44(extraout_var,iVar5);
      _outlen = "This is a debug label";
      buffer[0x3c] = '\0';
      buffer[0x3d] = '\0';
      buffer[0x3e] = '\0';
      buffer[0x3f] = '\0';
      buffer[0x38] = -1;
      buffer[0x39] = -1;
      buffer[0x3a] = -1;
      buffer[0x3b] = -1;
      GVar1 = this->m_identifier;
      if (GVar1 == 0x1702) {
        (**(code **)(msg + 0x6f8))(1,buffer + 0x3c);
        (**(code **)(msg + 0xb8))(0xde1,buffer._60_4_);
        (**(code **)(msg + 0xb8))(0xde1,0);
      }
      else if (GVar1 == 0x82e0) {
        (**(code **)(msg + 0x6c8))(1,buffer + 0x3c);
        (**(code **)(msg + 0x40))(0x8892,buffer._60_4_);
        (**(code **)(msg + 0x40))(0x8892,0);
      }
      else if (GVar1 == 0x82e1) {
        buffer._60_4_ = (**(code **)(msg + 0x3f0))(0x8b30);
      }
      else if (GVar1 == 0x82e2) {
        buffer._60_4_ = (**(code **)(msg + 0x3c8))();
      }
      else if (GVar1 == 0x82e3) {
        (**(code **)(msg + 0x6e0))(1,buffer + 0x3c);
        (**(code **)(msg + 0x20))(0x8c2f,buffer._60_4_);
        (**(code **)(msg + 0x628))(0x8c2f);
      }
      else if (GVar1 == 0x82e4) {
        (**(code **)(msg + 0x6d8))(1,buffer + 0x3c);
        (**(code **)(msg + 0x98))(buffer._60_4_);
        (**(code **)(msg + 0x98))(0);
      }
      else if (GVar1 == 0x82e6) {
        (**(code **)(msg + 0x6f0))(1,buffer + 0x3c);
        (**(code **)(msg + 0xa8))(0,buffer._60_4_);
        (**(code **)(msg + 0xa8))(0);
      }
      else if (GVar1 == 0x8d40) {
        (**(code **)(msg + 0x6d0))(1,buffer + 0x3c);
        (**(code **)(msg + 0x78))(0x8ca9,buffer._60_4_);
        pcVar2 = *(code **)(msg + 0x78);
        pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
        iVar5 = (*pRVar6->_vptr_RenderContext[6])();
        (*pcVar2)(0x8ca9,iVar5);
      }
      else if (GVar1 == 0x8d41) {
        (**(code **)(msg + 0x6e8))(1,buffer + 0x3c);
        (**(code **)(msg + 0xa0))(0x8d41,buffer._60_4_);
        (**(code **)(msg + 0xa0))(0x8d41,0);
      }
      else if (GVar1 == 0x8e22) {
        (**(code **)(msg + 0x700))(1,buffer + 0x3c);
        (**(code **)(msg + 0xd0))(0x8e22,buffer._60_4_);
        (**(code **)(msg + 0xd0))(0x8e22,0);
      }
      (**(code **)(msg + 0xfc0))
                (this->m_identifier,buffer._60_4_,0xffffffff,"This is a debug label");
      ::deMemset(local_78,0x58,0x40);
      (**(code **)(msg + 0x958))(this->m_identifier,buffer._60_4_,0x40,buffer + 0x38,local_78);
      if (buffer._56_4_ == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Failed to query debug label from object");
      }
      else {
        dVar4 = deStringEqual("This is a debug label",local_78);
        if (dVar4 == 0) {
          buffer[0x37] = '\0';
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_378,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_378,(char (*) [40])"Query returned wrong string: expected \"");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char **)&outlen);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])"\" but got \"");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [64])local_78);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b4bc5e);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_378);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Query returned wrong label");
        }
        else {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_1f8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_1f8,(char (*) [25])"Query returned string: \"");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [64])local_78);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b4bc5e);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1f8);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
        }
      }
      GVar1 = this->m_identifier;
      if (GVar1 == 0x1702) {
        (**(code **)(msg + 0x480))(1,buffer + 0x3c);
      }
      else if (GVar1 == 0x82e0) {
        (**(code **)(msg + 0x438))(1,buffer + 0x3c);
      }
      else if (GVar1 == 0x82e1) {
        (**(code **)(msg + 0x470))(buffer._60_4_);
      }
      else if (GVar1 == 0x82e2) {
        (**(code **)(msg + 0x448))(buffer._60_4_);
      }
      else if (GVar1 == 0x82e3) {
        (**(code **)(msg + 0x458))(1,buffer + 0x3c);
      }
      else if (GVar1 == 0x82e4) {
        (**(code **)(msg + 0x450))(1,buffer + 0x3c);
      }
      else if (GVar1 == 0x82e6) {
        (**(code **)(msg + 0x468))(1,buffer + 0x3c);
      }
      else if (GVar1 == 0x8d40) {
        (**(code **)(msg + 0x440))(1,buffer + 0x3c);
      }
      else if (GVar1 == 0x8d41) {
        (**(code **)(msg + 0x460))(1,buffer + 0x3c);
      }
      else if (GVar1 == 0x8e22) {
        (**(code **)(msg + 0x488))(1,buffer + 0x3c);
      }
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x698);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

LabelCase::IterateResult LabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const char*	const		msg			= "This is a debug label";
	GLuint					object		= 0;
	int						outlen		= -1;
	char					buffer[64];

	switch(m_identifier)
	{
		case GL_BUFFER:
			gl.genBuffers(1, &object);
			gl.bindBuffer(GL_ARRAY_BUFFER, object);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			break;

		case GL_SHADER:
			object = gl.createShader(GL_FRAGMENT_SHADER);
			break;

		case GL_PROGRAM:
			object = gl.createProgram();
			break;

		case GL_QUERY:
			gl.genQueries(1, &object);
			gl.beginQuery(GL_ANY_SAMPLES_PASSED, object); // Create
			gl.endQuery(GL_ANY_SAMPLES_PASSED); // Cleanup
			break;

		case GL_PROGRAM_PIPELINE:
			gl.genProgramPipelines(1, &object);
			gl.bindProgramPipeline(object); // Create
			gl.bindProgramPipeline(0); // Cleanup
			break;

		case GL_TRANSFORM_FEEDBACK:
			gl.genTransformFeedbacks(1, &object);
			gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, object);
			gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
			break;

		case GL_SAMPLER:
			gl.genSamplers(1, &object);
			gl.bindSampler(0, object);
			gl.bindSampler(0, 0);
			break;

		case GL_TEXTURE:
			gl.genTextures(1, &object);
			gl.bindTexture(GL_TEXTURE_2D, object);
			gl.bindTexture(GL_TEXTURE_2D, 0);
			break;

		case GL_RENDERBUFFER:
			gl.genRenderbuffers(1, &object);
			gl.bindRenderbuffer(GL_RENDERBUFFER, object);
			gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
			break;

		case GL_FRAMEBUFFER:
			gl.genFramebuffers(1, &object);
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, object);
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
			break;

		default:
			DE_FATAL("Invalid identifier");
	}

	gl.objectLabel(m_identifier, object, -1, msg);

	deMemset(buffer, 'X', sizeof(buffer));
	gl.getObjectLabel(m_identifier, object, sizeof(buffer), &outlen, buffer);

	if (outlen == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to query debug label from object");
	else if (deStringEqual(msg, buffer))
	{
		m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		buffer[63] = '\0'; // make sure buffer is null terminated before printing
		m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << msg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query returned wrong label");
	}

	switch(m_identifier)
	{
		case GL_BUFFER:				gl.deleteBuffers(1, &object);				break;
		case GL_SHADER:				gl.deleteShader(object);					break;
		case GL_PROGRAM:			gl.deleteProgram(object);					break;
		case GL_QUERY:				gl.deleteQueries(1, &object);				break;
		case GL_PROGRAM_PIPELINE:	gl.deleteProgramPipelines(1, &object);		break;
		case GL_TRANSFORM_FEEDBACK:	gl.deleteTransformFeedbacks(1, &object);	break;
		case GL_SAMPLER:			gl.deleteSamplers(1, &object);				break;
		case GL_TEXTURE:			gl.deleteTextures(1, &object);				break;
		case GL_RENDERBUFFER:		gl.deleteRenderbuffers(1, &object);			break;
		case GL_FRAMEBUFFER:		gl.deleteFramebuffers(1, &object);			break;

		default:
			DE_FATAL("Invalid identifier");
	}

	return STOP;
}